

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void al_unregister_event_source(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT_SOURCE *source)

{
  byte bVar1;
  ALLEGRO_EVENT_SOURCE *in_RSI;
  _AL_VECTOR *in_RDI;
  _Bool found;
  ALLEGRO_EVENT_SOURCE *in_stack_00000028;
  ALLEGRO_EVENT_QUEUE *in_stack_00000030;
  undefined7 in_stack_ffffffffffffffe8;
  
  _al_mutex_lock((_AL_MUTEX *)0x1740bc);
  bVar1 = _al_vector_find_and_delete(in_RDI,in_RSI);
  _al_mutex_unlock((_AL_MUTEX *)0x1740df);
  if ((bVar1 & 1) != 0) {
    _al_event_source_on_unregistration_from_queue
              (in_RSI,(ALLEGRO_EVENT_QUEUE *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
    _al_mutex_lock((_AL_MUTEX *)0x174103);
    discard_events_of_source(in_stack_00000030,in_stack_00000028);
    _al_mutex_unlock((_AL_MUTEX *)0x174120);
  }
  return;
}

Assistant:

void al_unregister_event_source(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT_SOURCE *source)
{
   bool found;
   ASSERT(queue);
   ASSERT(source);

   /* Remove source from our list. */
   _al_mutex_lock(&queue->mutex);
   found = _al_vector_find_and_delete(&queue->sources, &source);
   _al_mutex_unlock(&queue->mutex);

   if (found) {
      /* Tell the event source that it was unregistered. */
      _al_event_source_on_unregistration_from_queue(source, queue);

      /* Drop all the events in the queue that belonged to the source. */
      _al_mutex_lock(&queue->mutex);
      discard_events_of_source(queue, source);
      _al_mutex_unlock(&queue->mutex);
   }
}